

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapAllocator.cpp
# Opt level: O1

void __thiscall Memory::HeapAllocator::~HeapAllocator(HeapAllocator *this)

{
  bool bVar1;
  bool bVar2;
  char16 *pcVar3;
  undefined1 local_58 [8];
  TrackAllocData data;
  AutoHandledExceptionType __autoHandledExceptionType;
  
  bVar1 = Js::ConfigFlagsTable::IsEnabled
                    ((ConfigFlagsTable *)&Js::Configuration::Global,LeakReportFlag);
  if (bVar1) {
    bVar1 = DAT_015bbda8 == '\x01';
    if (bVar1) {
      AutoHandledExceptionType::AutoHandledExceptionType
                ((AutoHandledExceptionType *)&data.field_0x27,ExceptionType_DisableCheck);
      local_58 = (undefined1  [8])&~HeapAllocator()::$_0::operator()()::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_26d17de;
      data.filename._0_4_ = 0x172;
      TrackAllocInfo(&Instance,(TrackAllocData *)local_58);
      new<Memory::HeapAllocator>(4,&Instance,0x300d4a);
      AutoHandledExceptionType::~AutoHandledExceptionType
                ((AutoHandledExceptionType *)&data.field_0x27);
    }
    LeakReport::StartSection(L"Heap Leaks");
    LeakReport::StartRedirectOutput();
    bVar2 = HeapAllocatorData::CheckLeaks(&Instance.data);
    LeakReport::EndRedirectOutput();
    LeakReport::EndSection();
    LeakReport::Print(
                     L"--------------------------------------------------------------------------------\n"
                     );
    if (!bVar2) {
      LeakReport::Print(L"Heap Leaked Object: %d bytes (%d objects)\n",(this->data).outstandingBytes
                        ,(this->data).allocCount - (this->data).deleteCount);
    }
  }
  else {
    bVar1 = false;
  }
  if (DAT_015aa3ad == '\x01') {
    if ((DAT_015bbda8 == '\x01') && (!bVar1)) {
      AutoHandledExceptionType::AutoHandledExceptionType
                ((AutoHandledExceptionType *)&data.field_0x27,ExceptionType_DisableCheck);
      local_58 = (undefined1  [8])&~HeapAllocator()::$_0::operator()()::typeinfo;
      data.typeinfo = (type_info *)0x0;
      data.plusSize = 0xffffffffffffffff;
      data.count = (size_t)anon_var_dwarf_26d17de;
      data.filename._0_4_ = 0x172;
      TrackAllocInfo(&Instance,(TrackAllocData *)local_58);
      new<Memory::HeapAllocator>(4,&Instance,0x300d4a);
      AutoHandledExceptionType::~AutoHandledExceptionType
                ((AutoHandledExceptionType *)&data.field_0x27);
    }
    Output::CaptureStart();
    Output::Print(
                 L"-------------------------------------------------------------------------------------\n"
                 );
    Output::Print(L"Heap Leaks\n");
    Output::Print(
                 L"-------------------------------------------------------------------------------------\n"
                 );
    bVar1 = HeapAllocatorData::CheckLeaks(&Instance.data);
    if (bVar1) {
      pcVar3 = Output::CaptureEnd();
      free(pcVar3);
    }
    else {
      Output::Print(
                   L"-------------------------------------------------------------------------------------\n"
                   );
      Output::Print(L"Heap Leaked Object: %d bytes (%d objects)\n",(this->data).outstandingBytes,
                    (this->data).allocCount - (this->data).deleteCount);
      pcVar3 = Output::CaptureEnd();
      MemoryLeakCheck::AddLeakDump
                (pcVar3,(this->data).outstandingBytes,
                 (this->data).allocCount - (this->data).deleteCount);
    }
  }
  if ((DAT_015bbda5 == '\x01') && (this->m_privateHeap != (HANDLE)0x0)) {
    this->m_privateHeap = (HANDLE)0x0;
  }
  return;
}

Assistant:

HeapAllocator::~HeapAllocator()
{
#ifdef HEAP_TRACK_ALLOC
    bool hasFakeHeapLeak = false;
    auto fakeHeapLeak = [&]()
    {
        // REVIEW: Okay to use global flags?
        if (Js::Configuration::Global.flags.ForceMemoryLeak && !hasFakeHeapLeak)
        {
            AUTO_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
            struct FakeMemory { int f; };
            HeapNewStruct(FakeMemory);
            hasFakeHeapLeak = true;
        }
    };

#ifdef LEAK_REPORT
    // REVIEW: Okay to use global flags?
    if (Js::Configuration::Global.flags.IsEnabled(Js::LeakReportFlag))
    {
        fakeHeapLeak();
        LeakReport::StartSection(_u("Heap Leaks"));
        LeakReport::StartRedirectOutput();
        bool leaked = !HeapAllocator::CheckLeaks();
        LeakReport::EndRedirectOutput();
        LeakReport::EndSection();

        LeakReport::Print(_u("--------------------------------------------------------------------------------\n"));
        if (leaked)
        {
            LeakReport::Print(_u("Heap Leaked Object: %d bytes (%d objects)\n"),
                data.outstandingBytes, data.allocCount - data.deleteCount);
        }
    }
#endif // LEAK_REPORT

#ifdef CHECK_MEMORY_LEAK
    // REVIEW: Okay to use global flags?
    if (Js::Configuration::Global.flags.CheckMemoryLeak)
    {
        fakeHeapLeak();
        Output::CaptureStart();
        Output::Print(_u("-------------------------------------------------------------------------------------\n"));
        Output::Print(_u("Heap Leaks\n"));
        Output::Print(_u("-------------------------------------------------------------------------------------\n"));
        if (!HeapAllocator::CheckLeaks())
        {
            Output::Print(_u("-------------------------------------------------------------------------------------\n"));
            Output::Print(_u("Heap Leaked Object: %d bytes (%d objects)\n"),
                data.outstandingBytes, data.allocCount - data.deleteCount);
            char16 * buffer = Output::CaptureEnd();
            MemoryLeakCheck::AddLeakDump(buffer, data.outstandingBytes, data.allocCount - data.deleteCount);
        }
        else
        {
            free(Output::CaptureEnd());
        }
    }
#endif // CHECK_MEMORY_LEAK
#endif // HEAP_TRACK_ALLOC

    // destroy private heap after leak check
    if (CONFIG_FLAG(PrivateHeap))
    {
        this->DestroyPrivateHeap();
    }

#ifdef INTERNAL_MEM_PROTECT_HEAP_ALLOC
    if (memProtectHeapHandle != nullptr)
    {
        MemProtectHeapDestroy(memProtectHeapHandle);
    }
#endif // INTERNAL_MEM_PROTECT_HEAP_ALLOC
}